

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomp.c
# Opt level: O2

void ddb_ex(long ndims,Integer *ardims,long npes,double threshold,Integer *blk,Integer *pedims)

{
  Integer *ardims_00;
  long lVar1;
  Integer *pedims_00;
  long *__ptr;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  
  if (ndims == 1) {
    *pedims = npes;
    dd_ev(1,ardims,pedims);
    dd_su(1,ardims,pedims,blk);
    return;
  }
  ardims_00 = (Integer *)calloc(ndims,8);
  if (ardims_00 == (Integer *)0x0) {
    fwrite("ddb_ex: Memory allocation failed\n",0x21,1,_stderr);
    lVar3 = 0;
    if (ndims < 1) {
      ndims = lVar3;
    }
    for (; ndims != lVar3; lVar3 = lVar3 + 1) {
      blk[lVar3] = 0;
    }
  }
  else {
    lVar1 = 0;
    lVar3 = 0;
    if (0 < ndims) {
      lVar3 = ndims;
    }
    for (; lVar3 != lVar1; lVar1 = lVar1 + 1) {
      if (blk[lVar1] < 1) {
        blk[lVar1] = 1;
      }
    }
    for (lVar1 = 0; lVar3 != lVar1; lVar1 = lVar1 + 1) {
      ardims_00[lVar1] = ardims[lVar1] / blk[lVar1];
    }
    for (lVar1 = 0; lVar3 != lVar1; lVar1 = lVar1 + 1) {
      if (ardims_00[lVar1] < 1) {
        ardims_00[lVar1] = 1;
        blk[lVar1] = ardims[lVar1];
      }
    }
    pedims_00 = (Integer *)calloc(ndims,8);
    if (pedims_00 != (Integer *)0x0) {
      __ptr = (long *)calloc(ndims,8);
      if (__ptr == (long *)0x0) {
        fprintf(_stderr,"%s: %s\n","ddb_ex","memory allocation failed");
        for (lVar1 = 0; lVar3 != lVar1; lVar1 = lVar1 + 1) {
          blk[lVar1] = 0;
        }
      }
      else {
        lVar1 = 1;
        for (lVar2 = 0; lVar3 != lVar2; lVar2 = lVar2 + 1) {
          lVar1 = lVar1 * ardims_00[lVar2];
        }
        *pedims = npes;
        for (lVar2 = 1; lVar2 < ndims; lVar2 = lVar2 + 1) {
          pedims[lVar2] = 1;
        }
        *__ptr = npes;
        dVar9 = -1.0;
        lVar2 = 0;
        do {
          while( true ) {
            while (lVar2 == ndims + -1) {
              pedims_00[ndims + -1] = __ptr[ndims + -1];
              dVar8 = dd_ev(ndims,ardims_00,pedims_00);
              lVar2 = 0;
              for (lVar4 = 0; lVar4 != lVar3; lVar4 = lVar4 + 1) {
                lVar5 = 1;
                for (lVar6 = 0; ndims != lVar6; lVar6 = lVar6 + 1) {
                  if (lVar4 != lVar6) {
                    lVar5 = lVar5 * (ardims_00[lVar6] / pedims_00[lVar6]);
                  }
                }
                lVar2 = lVar2 + lVar5;
              }
              if ((dVar9 < dVar8) ||
                 (((dVar8 == dVar9 && (!NAN(dVar8) && !NAN(dVar9))) && (lVar2 < lVar1)))) {
                for (lVar4 = 0; lVar1 = lVar2, dVar9 = dVar8, lVar3 != lVar4; lVar4 = lVar4 + 1) {
                  pedims[lVar4] = pedims_00[lVar4];
                }
              }
              if (threshold < dVar9) goto LAB_001db412;
              pedims_00[ndims + -1] = 0;
              lVar2 = ndims + -2;
            }
            lVar4 = pedims_00[lVar2];
            if (lVar4 == __ptr[lVar2]) break;
            do {
              lVar4 = lVar4 + 1;
            } while (__ptr[lVar2] % lVar4 != 0);
            pedims_00[lVar2] = lVar4;
            __ptr[lVar2 + 1] = npes;
            lVar4 = npes;
            for (lVar5 = 0; lVar5 <= lVar2; lVar5 = lVar5 + 1) {
              lVar4 = lVar4 / pedims_00[lVar5];
              __ptr[lVar2 + 1] = lVar4;
            }
            pedims_00[lVar2 + 1] = 0;
            lVar2 = lVar2 + 1;
          }
          pedims_00[lVar2] = 0;
          bVar7 = lVar2 != 0;
          lVar2 = lVar2 + -1;
        } while (bVar7);
LAB_001db412:
        dd_su(ndims,ardims,pedims,blk);
        free(ardims_00);
        free(__ptr);
        ardims_00 = pedims_00;
      }
      free(ardims_00);
      return;
    }
    fwrite("ddb_ex: Memory allocation failed\n",0x21,1,_stderr);
    for (lVar1 = 0; lVar3 != lVar1; lVar1 = lVar1 + 1) {
      blk[lVar1] = 0;
    }
  }
  return;
}

Assistant:

void ddb_ex( long ndims, Integer ardims[], long npes, double threshold,
             Integer blk[], Integer pedims[])
{
      Integer *tdims;
      long *pdivs;
      long npdivs;
      long i, j, k;
      long bev;
      long pc, done;
      long *stack;
      Integer *tard;
      long r, cev;
      double clb, blb;

      /*- Quick exit -*/
      if(ndims==1) {
           pedims[0] = npes;
           blb = dd_ev(ndims,ardims,pedims);
           dd_su(1,ardims,pedims,blk);
           return;
      }

      /*- Reset array dimensions to reflect granularity -*/
      tard = (Integer *) calloc((size_t)ndims,sizeof(Integer));
      if(tard==NULL) {
         fprintf(stderr,"ddb_ex: Memory allocation failed\n");
         for(i=0;i<ndims;i++) blk[i] = 0;
         return;
      }
      for(i=0;i<ndims;i++) if (blk[i]<1) blk[i] = 1;
      for(i=0;i<ndims;i++) tard[i] = ardims[i] / blk[i];
      for(i=0;i<ndims;i++) if (tard[i]<1) {
         tard[i] = 1; blk[i] = ardims[i]; }

      /*- Allocate memory for current solution -*/
      tdims = (Integer *) calloc((size_t)ndims,sizeof(Integer));
      if(tdims==NULL) {
         fprintf(stderr,"ddb_ex: Memory allocation failed\n");
         for(i=0;i<ndims;i++) blk[i] = 0;
         return;
      }

      /*- Allocate memory to hold divisors of npes -*/
      npdivs = 1;
      for(i=2;i<=npes;i++) if(npes%i==0) npdivs += 1;
      pdivs = (long *) calloc((size_t)npdivs,sizeof(long));
      if(pdivs==NULL) {
         fprintf(stderr,"ddb_ex: Memory allocation failed\n");
         for(i=0;i<ndims;i++) blk[i] = 0;
         free(tard);
         return;
      }

      /*- Allocate storage for the recursion stack -*/
      stack = (long *) calloc((size_t)ndims,sizeof(long));
      if(stack==NULL){
         fprintf(stderr,"%s: %s\n","ddb_ex",
             "memory allocation failed");
         for(i=0;i<ndims;i++) blk[i] = 0;
         free(tard);
         free(pdivs);
         return;
      }

      /*- Find all divisors of npes -*/
      for(j=0,i=1;i<=npes;i++) if(npes%i==0) pdivs[j++] = i;

      /*- Pump priming the exhaustive search -*/
      blb = -1.0;
      bev = 1.0;
      for(i=0;i<ndims;i++) bev *= tard[i];
      pedims[0]=npes; for(i=1;i<ndims;i++) pedims[i] = 1;
      tdims[0] = 0;
      stack[0] = npes;
      pc = 0;
      done = 0;

      /*-  Recursion loop -*/
      do {
         if(pc==ndims-1) {
	   /*- Set the number of processes for the last dimension -*/
           tdims[pc] = stack[pc];

	   /*- Evaluate current solution  -*/
            clb = dd_ev(ndims,tard,tdims);
            cev = 0;
            for(k=0; k<ndims; k++){
               r = 1;
               for(j=0; j<ndims; j++) {
                  if(j!=k) r = r*(tard[j]/tdims[j]);
               }
               cev = cev+r;
            }
            if(clb>blb || (clb==blb && cev<bev)) {
               for(j=0; j<ndims; j++) pedims[j] = tdims[j];
               blb = clb;
               bev = cev;
            }
            if(blb>threshold) break;
            tdims[pc] = 0;
            pc -= 1;
         } else {
           if( tdims[pc] == stack[pc] ) {
	     /*- Backtrack when current array dimension has exhausted 
              *- all remaining processes
              */
              done = (pc==0);
              tdims[pc] = 0;
              pc -= 1;
           } else {
	     /*- Increment the number of processes assigned to the current
              *- array axis.
              */
              for(tdims[pc]+=1; stack[pc]%tdims[pc]!=0; tdims[pc]+=1);
              pc += 1;
              stack[pc] = npes;
              for(i=0;i<pc;i++) stack[pc] /= tdims[i];
              tdims[pc] = 0;
           }
         }
      } while(!done);

      dd_su(ndims,ardims,pedims,blk);

      free(tard);
      free(stack);
      free(tdims);
      free(pdivs);
}